

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_parse_string_with_comments(char *string)

{
  char *local_30;
  char *string_mutable_copy_ptr;
  char *string_mutable_copy;
  JSON_Value *result;
  char *string_local;
  
  string_mutable_copy = (char *)0x0;
  string_mutable_copy_ptr = (char *)0x0;
  local_30 = (char *)0x0;
  result = (JSON_Value *)string;
  string_mutable_copy_ptr = parson_strdup(string);
  if (string_mutable_copy_ptr == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    remove_comments(string_mutable_copy_ptr,"/*","*/");
    remove_comments(string_mutable_copy_ptr,"//","\n");
    local_30 = string_mutable_copy_ptr;
    string_mutable_copy = (char *)parse_value(&local_30,0);
    (*parson_free)(string_mutable_copy_ptr);
    string_local = string_mutable_copy;
  }
  return (JSON_Value *)string_local;
}

Assistant:

JSON_Value * json_parse_string_with_comments(const char *string) {
    JSON_Value *result = NULL;
    char *string_mutable_copy = NULL, *string_mutable_copy_ptr = NULL;
    string_mutable_copy = parson_strdup(string);
    if (string_mutable_copy == NULL) {
        return NULL;
    }
    remove_comments(string_mutable_copy, "/*", "*/");
    remove_comments(string_mutable_copy, "//", "\n");
    string_mutable_copy_ptr = string_mutable_copy;
    result = parse_value((const char**)&string_mutable_copy_ptr, 0);
    parson_free(string_mutable_copy);
    return result;
}